

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O2

void __thiscall string_view_operator_bracket_Test::TestBody(string_view_operator_bracket_Test *this)

{
  int line;
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  local_38.ptr_._0_1_ = 0x77;
  testing::internal::CmpHelperEQ<char,char>
            ((internal *)&gtest_ar,"\'w\'","sv[0]",(char *)&local_38,"words");
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x97;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_38.ptr_._0_1_ = 0x6f;
    testing::internal::CmpHelperEQ<char,char>
              ((internal *)&gtest_ar,"\'o\'","sv[1]",(char *)&local_38,"ords");
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_38);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x98;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_38.ptr_._0_1_ = 0x72;
      testing::internal::CmpHelperEQ<char,char>
                ((internal *)&gtest_ar,"\'r\'","sv[2]",(char *)&local_38,"rds");
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x99;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_38.ptr_._0_1_ = 100;
        testing::internal::CmpHelperEQ<char,char>
                  ((internal *)&gtest_ar,"\'d\'","sv[3]",(char *)&local_38,"ds");
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_38.ptr_._0_1_ = 0x73;
          testing::internal::CmpHelperEQ<char,char>
                    ((internal *)&gtest_ar,"\'s\'","sv[4]",(char *)&local_38,"s");
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_38);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_20,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                       ,0x9b,pcVar1);
            testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper(&local_20);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_38);
          }
          goto LAB_00201bcb;
        }
        testing::Message::Message((Message *)&local_38);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x9a;
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
             ,line,pcVar1);
  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
LAB_00201bcb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(string_view, operator_bracket) {
  string_view sv("words");
  ASSERT_EQ('w', sv[0]);
  ASSERT_EQ('o', sv[1]);
  ASSERT_EQ('r', sv[2]);
  ASSERT_EQ('d', sv[3]);
  ASSERT_EQ('s', sv[4]);
}